

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O3

void __thiscall CovarianceMatrix::generateCode(CovarianceMatrix *this)

{
  undefined8 *puVar1;
  pointer ppQVar2;
  bool bVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  ulong *puVar8;
  ulong uVar9;
  long *plVar10;
  ulong *puVar11;
  char cVar12;
  ulong uVar13;
  pointer ppQVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string runFunction;
  string __str_1;
  string __str;
  string dumpListOfQueries;
  ofstream ofs;
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0;
  long lStack_5d8;
  long *local_5d0;
  long local_5c8;
  long local_5c0;
  long lStack_5b8;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0;
  undefined8 uStack_598;
  long *local_590;
  long local_588;
  long local_580;
  long lStack_578;
  ulong *local_570;
  long local_568;
  ulong local_560;
  long lStack_558;
  ulong *local_550;
  long local_548;
  ulong local_540;
  long lStack_538;
  ulong *local_530;
  long local_528;
  ulong local_520;
  long lStack_518;
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  ulong *local_4f0;
  long local_4e8;
  ulong local_4e0;
  long lStack_4d8;
  ulong *local_4d0;
  long local_4c8;
  ulong local_4c0;
  long lStack_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0 [2];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0 [2];
  ulong *local_390;
  long local_388;
  ulong local_380 [2];
  ulong *local_370;
  long local_368;
  ulong local_360 [2];
  ulong *local_350;
  long local_348;
  ulong local_340 [2];
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"");
  ppQVar14 = (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppQVar2 = (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppQVar14 != ppQVar2) {
    do {
      puVar11 = *(ulong **)
                 &((*((*ppQVar14)->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data;
      uVar13 = *puVar11;
      cVar12 = '\x01';
      if (9 < uVar13) {
        uVar9 = uVar13;
        cVar4 = '\x04';
        do {
          cVar12 = cVar4;
          if (uVar9 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_0019688c;
          }
          if (uVar9 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_0019688c;
          }
          if (uVar9 < 10000) goto LAB_0019688c;
          bVar3 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar4 = cVar12 + '\x04';
        } while (bVar3);
        cVar12 = cVar12 + '\x01';
      }
LAB_0019688c:
      local_590 = &local_580;
      std::__cxx11::string::_M_construct((ulong)&local_590,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_590,(uint)local_588,uVar13);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_590);
      local_5f0 = &local_5e0;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_5e0 = *puVar8;
        lStack_5d8 = plVar5[3];
      }
      else {
        local_5e0 = *puVar8;
        local_5f0 = (ulong *)*plVar5;
      }
      local_5e8 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar13 = puVar11[1];
      cVar12 = '\x01';
      if (9 < uVar13) {
        uVar9 = uVar13;
        cVar4 = '\x04';
        do {
          cVar12 = cVar4;
          if (uVar9 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00196965;
          }
          if (uVar9 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00196965;
          }
          if (uVar9 < 10000) goto LAB_00196965;
          bVar3 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar4 = cVar12 + '\x04';
        } while (bVar3);
        cVar12 = cVar12 + '\x01';
      }
LAB_00196965:
      local_5b0 = &local_5a0;
      std::__cxx11::string::_M_construct((ulong)&local_5b0,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_5b0,(uint)local_5a8,uVar13);
      uVar13 = 0xf;
      if (local_5f0 != &local_5e0) {
        uVar13 = local_5e0;
      }
      if (uVar13 < (ulong)(local_5a8 + local_5e8)) {
        uVar13 = 0xf;
        if (local_5b0 != &local_5a0) {
          uVar13 = local_5a0;
        }
        if (uVar13 < (ulong)(local_5a8 + local_5e8)) goto LAB_001969d6;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_5b0,0,(char *)0x0,(ulong)local_5f0);
      }
      else {
LAB_001969d6:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f0,(ulong)local_5b0);
      }
      local_5d0 = &local_5c0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_5c0 = *plVar5;
        lStack_5b8 = puVar6[3];
      }
      else {
        local_5c0 = *plVar5;
        local_5d0 = (long *)*puVar6;
      }
      local_5c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_5d0);
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_220 = *plVar10;
        lStack_218 = plVar5[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *plVar10;
        local_230 = (long *)*plVar5;
      }
      local_228 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_2f0,(ulong)local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      if (local_5d0 != &local_5c0) {
        operator_delete(local_5d0);
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0);
      }
      if (local_5f0 != &local_5e0) {
        operator_delete(local_5f0);
      }
      if (local_590 != &local_580) {
        operator_delete(local_590);
      }
      ppQVar14 = ppQVar14 + 1;
    } while (ppQVar14 != ppQVar2);
  }
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_250);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_560 = *puVar11;
    lStack_558 = plVar5[3];
    local_570 = &local_560;
  }
  else {
    local_560 = *puVar11;
    local_570 = (ulong *)*plVar5;
  }
  local_568 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_330 = local_320;
  std::__cxx11::string::_M_construct((ulong)&local_330,'\x03');
  uVar13 = 0xf;
  if (local_570 != &local_560) {
    uVar13 = local_560;
  }
  if (uVar13 < (ulong)(local_328 + local_568)) {
    uVar13 = 0xf;
    if (local_330 != local_320) {
      uVar13 = local_320[0];
    }
    if (uVar13 < (ulong)(local_328 + local_568)) goto LAB_00196c1f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_570);
  }
  else {
LAB_00196c1f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_330);
  }
  local_4b0 = &local_4a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4a0 = *puVar1;
    uStack_498 = puVar6[3];
  }
  else {
    local_4a0 = *puVar1;
    local_4b0 = (undefined8 *)*puVar6;
  }
  local_4a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_540 = *puVar11;
    lStack_538 = plVar5[3];
    local_550 = &local_540;
  }
  else {
    local_540 = *puVar11;
    local_550 = (ulong *)*plVar5;
  }
  local_548 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_350 = local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x06');
  uVar13 = 0xf;
  if (local_550 != &local_540) {
    uVar13 = local_540;
  }
  if (uVar13 < (ulong)(local_348 + local_548)) {
    uVar13 = 0xf;
    if (local_350 != local_340) {
      uVar13 = local_340[0];
    }
    if (uVar13 < (ulong)(local_348 + local_548)) goto LAB_00196d6c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_550);
  }
  else {
LAB_00196d6c:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_350);
  }
  local_490 = &local_480;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_480 = *puVar1;
    uStack_478 = puVar6[3];
  }
  else {
    local_480 = *puVar1;
    local_490 = (undefined8 *)*puVar6;
  }
  local_488 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_520 = *puVar11;
    lStack_518 = plVar5[3];
    local_530 = &local_520;
  }
  else {
    local_520 = *puVar11;
    local_530 = (ulong *)*plVar5;
  }
  local_528 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_370 = local_360;
  std::__cxx11::string::_M_construct((ulong)&local_370,'\x06');
  uVar13 = 0xf;
  if (local_530 != &local_520) {
    uVar13 = local_520;
  }
  if (uVar13 < (ulong)(local_368 + local_528)) {
    uVar13 = 0xf;
    if (local_370 != local_360) {
      uVar13 = local_360[0];
    }
    if (uVar13 < (ulong)(local_368 + local_528)) goto LAB_00196eb9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_530);
  }
  else {
LAB_00196eb9:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_370);
  }
  local_470 = &local_460;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_460 = *puVar1;
    uStack_458 = puVar6[3];
  }
  else {
    local_460 = *puVar1;
    local_470 = (undefined8 *)*puVar6;
  }
  local_468 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_470);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_500 = *puVar11;
    lStack_4f8 = plVar5[3];
    local_510 = &local_500;
  }
  else {
    local_500 = *puVar11;
    local_510 = (ulong *)*plVar5;
  }
  local_508 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_390 = local_380;
  std::__cxx11::string::_M_construct((ulong)&local_390,'\x06');
  uVar13 = 0xf;
  if (local_510 != &local_500) {
    uVar13 = local_500;
  }
  if (uVar13 < (ulong)(local_388 + local_508)) {
    uVar13 = 0xf;
    if (local_390 != local_380) {
      uVar13 = local_380[0];
    }
    if (uVar13 < (ulong)(local_388 + local_508)) goto LAB_00197006;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_510);
  }
  else {
LAB_00197006:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_390);
  }
  local_450 = &local_440;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_440 = *puVar1;
    uStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar1;
    local_450 = (undefined8 *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
  local_2b0 = &local_2a0;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_2a0 = *plVar10;
    lStack_298 = plVar5[3];
  }
  else {
    local_2a0 = *plVar10;
    local_2b0 = (long *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_4e0 = *puVar11;
    lStack_4d8 = plVar5[3];
    local_4f0 = &local_4e0;
  }
  else {
    local_4e0 = *puVar11;
    local_4f0 = (ulong *)*plVar5;
  }
  local_4e8 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3b0 = local_3a0;
  std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x06');
  uVar13 = 0xf;
  if (local_4f0 != &local_4e0) {
    uVar13 = local_4e0;
  }
  if (uVar13 < (ulong)(local_3a8 + local_4e8)) {
    uVar13 = 0xf;
    if (local_3b0 != local_3a0) {
      uVar13 = local_3a0[0];
    }
    if (uVar13 < (ulong)(local_3a8 + local_4e8)) goto LAB_001971b4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_4f0);
  }
  else {
LAB_001971b4:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_3b0);
  }
  local_430 = &local_420;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_420 = *puVar1;
    uStack_418 = puVar6[3];
  }
  else {
    local_420 = *puVar1;
    local_430 = (undefined8 *)*puVar6;
  }
  local_428 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_4c0 = *puVar11;
    lStack_4b8 = plVar5[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *puVar11;
    local_4d0 = (ulong *)*plVar5;
  }
  local_4c8 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,'\x06');
  uVar13 = 0xf;
  if (local_4d0 != &local_4c0) {
    uVar13 = local_4c0;
  }
  if (uVar13 < (ulong)(local_3c8 + local_4c8)) {
    uVar13 = 0xf;
    if (local_3d0 != local_3c0) {
      uVar13 = local_3c0[0];
    }
    if (uVar13 < (ulong)(local_3c8 + local_4c8)) goto LAB_00197302;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_4d0);
  }
  else {
LAB_00197302:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_3d0);
  }
  local_410 = &local_400;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_400 = *puVar1;
    uStack_3f8 = puVar6[3];
  }
  else {
    local_400 = *puVar1;
    local_410 = (undefined8 *)*puVar6;
  }
  local_408 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_410);
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_260 = *plVar10;
    lStack_258 = plVar5[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar10;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_2f0[0]);
  local_290 = &local_280;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_280 = *plVar10;
    lStack_278 = plVar5[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = plVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
    local_310 = (ulong *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct((ulong)&local_3f0,'\x06');
  uVar13 = 0xf;
  if (local_310 != &local_300) {
    uVar13 = local_300;
  }
  if (uVar13 < (ulong)(local_3e8 + local_308)) {
    uVar13 = 0xf;
    if (local_3f0 != local_3e0) {
      uVar13 = local_3e0[0];
    }
    if (uVar13 < (ulong)(local_3e8 + local_308)) goto LAB_0019751d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0019751d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_3f0);
  }
  local_5b0 = &local_5a0;
  puVar11 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar11) {
    local_5a0 = *puVar11;
    uStack_598 = puVar6[3];
  }
  else {
    local_5a0 = *puVar11;
    local_5b0 = (ulong *)*puVar6;
  }
  local_5a8 = puVar6[1];
  *puVar6 = puVar11;
  puVar6[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5b0);
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_580 = *plVar10;
    lStack_578 = plVar5[3];
    local_590 = &local_580;
  }
  else {
    local_580 = *plVar10;
    local_590 = (long *)*plVar5;
  }
  local_588 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_590);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_5e0 = *puVar11;
    lStack_5d8 = plVar5[3];
    local_5f0 = &local_5e0;
  }
  else {
    local_5e0 = *puVar11;
    local_5f0 = (ulong *)*plVar5;
  }
  local_5e8 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x03');
  uVar13 = 0xf;
  if (local_5f0 != &local_5e0) {
    uVar13 = local_5e0;
  }
  if (uVar13 < (ulong)(local_2c8 + local_5e8)) {
    uVar13 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar13 = local_2c0[0];
    }
    if ((ulong)(local_2c8 + local_5e8) <= uVar13) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_5f0);
      goto LAB_001976c4;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f0,(ulong)local_2d0);
LAB_001976c4:
  local_230 = &local_220;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_220 = *plVar5;
    lStack_218 = puVar6[3];
  }
  else {
    local_220 = *plVar5;
    local_230 = (long *)*puVar6;
  }
  local_228 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_5d0 = &local_5c0;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_5c0 = *plVar10;
    lStack_5b8 = plVar5[3];
  }
  else {
    local_5c0 = *plVar10;
    local_5d0 = (long *)*plVar5;
  }
  local_5c8 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_390 != local_380) {
    operator_delete(local_390);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470);
  }
  if (local_370 != local_360) {
    operator_delete(local_370);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490);
  }
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0);
  }
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  local_5f0 = &local_5e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5f0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_5f0);
  std::ofstream::ofstream(&local_230,(string *)&local_5f0,_S_out);
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#include \"DataHandler.h\"\n\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
  local_590 = &local_580;
  std::__cxx11::string::_M_construct((ulong)&local_590,'\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_590);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar11) {
    local_5e0 = *puVar11;
    lStack_5d8 = plVar5[3];
    local_5f0 = &local_5e0;
  }
  else {
    local_5e0 = *puVar11;
    local_5f0 = (ulong *)*plVar5;
  }
  local_5e8 = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_5f0,local_5e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n",0x2f);
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590);
  }
  std::ofstream::close();
  local_5f0 = &local_5e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5f0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_5f0);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_5f0);
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#include \"ApplicationHandler.h\"\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(char *)local_5d0,local_5c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}\n",2);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _error_with_option_name;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0]);
  }
  return;
}

Assistant:

void CovarianceMatrix::generateCode()
{
    std::string dumpListOfQueries = "";

    for (Query* query : listOfQueries)
    {
        std::pair<size_t,size_t>& viewAggPair = query->_aggregates[0]->_incoming[0];
        
        dumpListOfQueries += std::to_string(viewAggPair.first)+","+
            std::to_string(viewAggPair.second)+"\\n";
    }
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\n\";\n"+
        offset(2)+"ofs.close();\n\n"+
        "#ifdef DUMP_OUTPUT\n"+
        offset(2)+"ofs.open(\"output/covarianceMatrix.out\");\n"+
        offset(2)+"ofs << \""+dumpListOfQueries+"\";\n"+
        offset(2)+"ofs.close();\n"+
        "#endif /* DUMP_OUTPUT */ \n"+
        offset(1)+"}\n";
    
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
}